

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O1

string * __thiscall
google::DescribeOneFlag_abi_cxx11_
          (string *__return_storage_ptr__,google *this,CommandLineFlagInfo *flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  CommandLineFlagInfo *flag_00;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  long *plVar9;
  size_type *psVar10;
  size_type sVar11;
  uint uVar12;
  ulong uVar13;
  _Alloc_hider __s;
  int chars_in_line;
  string main_part;
  int local_a4;
  string local_a0;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  CommandLineFlagInfo *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_58 = (CommandLineFlagInfo *)this;
  SStringPrintf(&local_50,"    -%s (%s)",*(undefined8 *)this,*(undefined8 *)(this + 0x40));
  sVar11 = local_50._M_string_length;
  __s._M_p = local_50._M_dataplus._M_p;
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_a4 = 0;
  do {
    iVar6 = (int)sVar11;
    sVar7 = strlen(__s._M_p);
    if (sVar7 != (long)iVar6) {
      __assert_fail("chars_left == strlen(c_string)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags_reporting.cc"
                    ,0x81,"string google::DescribeOneFlag(const CommandLineFlagInfo &)");
    }
    pcVar8 = strchr(__s._M_p,10);
    if (pcVar8 == (char *)0x0) {
      if (0x4f < local_a4 + iVar6) goto LAB_00197aa0;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_a4 = local_a4 + iVar6;
LAB_00197ba0:
      iVar6 = 3;
    }
    else if ((long)pcVar8 - (long)__s._M_p < 0x50 - (long)local_a4) {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s._M_p);
      uVar12 = (uint)((long)pcVar8 - (long)__s._M_p);
      __s._M_p = __s._M_p + (long)(int)uVar12 + 1;
      sVar11 = (size_type)(~uVar12 + iVar6);
LAB_00197b7d:
      if (*__s._M_p == '\0') goto LAB_00197ba0;
      StringAppendF(__return_storage_ptr__,"\n      ");
      local_a4 = 6;
      iVar6 = 0;
    }
    else {
LAB_00197aa0:
      uVar12 = 0x4f - local_a4;
      bVar3 = 0 < (int)uVar12;
      if ((int)uVar12 < 1) {
LAB_00197b60:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_a4 = 0x50;
        iVar6 = 3;
      }
      else {
        uVar13 = (ulong)uVar12;
        iVar5 = isspace((int)__s._M_p[uVar13]);
        if (iVar5 == 0) {
          do {
            bVar3 = 1 < (long)uVar13;
            if ((long)uVar13 < 2) goto LAB_00197b60;
            lVar4 = uVar13 - 1;
            uVar13 = uVar13 - 1;
            iVar5 = isspace((int)__s._M_p[lVar4]);
          } while (iVar5 == 0);
          uVar12 = (uint)uVar13;
        }
        if (!bVar3) goto LAB_00197b60;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,__s._M_p,__s._M_p + (uVar13 & 0xffffffff));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        local_a4 = local_a4 + (int)uVar13;
        __s._M_p = __s._M_p + ((ulong)uVar12 - 1);
        sVar11 = (size_type)((iVar6 - uVar12) + 1);
        do {
          pcVar8 = __s._M_p + 1;
          __s._M_p = __s._M_p + 1;
          iVar6 = isspace((int)*pcVar8);
          sVar11 = (size_type)((int)sVar11 - 1);
        } while (iVar6 != 0);
        iVar6 = 0;
      }
      if (bVar3) goto LAB_00197b7d;
    }
    if (iVar6 != 0) {
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"type: ","");
      flag_00 = local_58;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_80,(ulong)(local_58->type)._M_dataplus._M_p);
      paVar2 = &local_a0.field_2;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_a0.field_2._M_allocated_capacity = *psVar10;
        local_a0.field_2._8_8_ = plVar9[3];
        local_a0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar10;
        local_a0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_a0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      AddString(&local_a0,__return_storage_ptr__,&local_a4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"default","");
      PrintStringFlagsWithQuotes(&local_a0,flag_00,&local_80,false);
      AddString(&local_a0,__return_storage_ptr__,&local_a4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (flag_00->is_default == false) {
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"currently","");
        PrintStringFlagsWithQuotes(&local_a0,flag_00,&local_80,true);
        AddString(&local_a0,__return_storage_ptr__,&local_a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      StringAppendF(__return_storage_ptr__,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string DescribeOneFlag(const CommandLineFlagInfo& flag) {
  string main_part;
  SStringPrintf(&main_part, "    -%s (%s)",
                flag.name.c_str(),
                flag.description.c_str());
  const char* c_string = main_part.c_str();
  int chars_left = static_cast<int>(main_part.length());
  string final_string = "";
  int chars_in_line = 0;  // how many chars in current line so far?
  while (1) {
    assert(chars_left == strlen(c_string));  // Unless there's a \0 in there?
    const char* newline = strchr(c_string, '\n');
    if (newline == NULL && chars_in_line+chars_left < kLineLength) {
      // The whole remainder of the string fits on this line
      final_string += c_string;
      chars_in_line += chars_left;
      break;
    }
    if (newline != NULL && newline - c_string < kLineLength - chars_in_line) {
      int n = static_cast<int>(newline - c_string);
      final_string.append(c_string, n);
      chars_left -= n + 1;
      c_string += n + 1;
    } else {
      // Find the last whitespace on this 80-char line
      int whitespace = kLineLength-chars_in_line-1;  // < 80 chars/line
      while ( whitespace > 0 && !isspace(c_string[whitespace]) ) {
        --whitespace;
      }
      if (whitespace <= 0) {
        // Couldn't find any whitespace to make a line break.  Just dump the
        // rest out!
        final_string += c_string;
        chars_in_line = kLineLength;  // next part gets its own line for sure!
        break;
      }
      final_string += string(c_string, whitespace);
      chars_in_line += whitespace;
      while (isspace(c_string[whitespace]))  ++whitespace;
      c_string += whitespace;
      chars_left -= whitespace;
    }
    if (*c_string == '\0')
      break;
    StringAppendF(&final_string, "\n      ");
    chars_in_line = 6;
  }

  // Append data type
  AddString(string("type: ") + flag.type, &final_string, &chars_in_line);
  // The listed default value will be the actual default from the flag
  // definition in the originating source file, unless the value has
  // subsequently been modified using SetCommandLineOptionWithMode() with mode
  // SET_FLAGS_DEFAULT, or by setting FLAGS_foo = bar before ParseCommandLineFlags().
  AddString(PrintStringFlagsWithQuotes(flag, "default", false), &final_string,
            &chars_in_line);
  if (!flag.is_default) {
    AddString(PrintStringFlagsWithQuotes(flag, "currently", true),
              &final_string, &chars_in_line);
  }

  StringAppendF(&final_string, "\n");
  return final_string;
}